

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_matcher.hpp
# Opt level: O3

string_t * __thiscall
PathMatcher<int>::get_wildcard_value
          (string_t *__return_storage_ptr__,PathMatcher<int> *this,string_t *path,size_t *pos)

{
  char cVar1;
  pointer pcVar2;
  ulong uVar3;
  
  uVar3 = *pos;
  if (uVar3 < path->_M_string_length - 1) {
    pcVar2 = (path->_M_dataplus)._M_p;
    cVar1 = this->trailing_wildcard_;
    do {
      uVar3 = uVar3 + 1;
      if (pcVar2[uVar3] == cVar1) break;
      *pos = uVar3;
    } while (uVar3 < path->_M_string_length - 1);
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)path);
  return __return_storage_ptr__;
}

Assistant:

string_t get_wildcard_value(string_t &path, size_t &pos) {
        // Walks down the input until the trailing_wildcard_ is found or the end is reached, everything between equals the wildcard value
        int begin = pos;
        for (; pos < path.size() - 1; pos++) {
            if (path[pos + 1] == trailing_wildcard_) {
                return path.substr(begin, pos - begin + 1);
            }
        }
        return path.substr(begin);
    }